

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<float,long,double>
                 (size_t col_num,size_t nrows,float *Xc,long *Xc_ind,long *Xc_indptr,
                 MissingAction missing_action,float *w)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar5;
  double dVar6;
  double dVar7;
  float *Xc_00;
  undefined1 auVar8 [16];
  long in_stack_00000008;
  double out;
  double v;
  double sn;
  long ix_2;
  long ix_1;
  double xval;
  long ix;
  double cnt;
  double w_this;
  double x_sq;
  double s4;
  double s3;
  double s2;
  double s1;
  undefined8 in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar9;
  byte in_stack_ffffffffffffff57;
  long *in_stack_ffffffffffffff58;
  float *col;
  long local_90;
  long local_88;
  long local_78;
  double local_70;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  if (*(long *)(in_R8 + in_RDI * 8) == *(long *)(in_R8 + 8 + in_RDI * 8)) {
    local_8 = -INFINITY;
  }
  else {
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    lVar4 = in_RSI + (*(long *)(in_R8 + in_RDI * 8) - *(long *)(in_R8 + 8 + in_RDI * 8));
    auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar8._0_8_ = lVar4;
    auVar8._12_4_ = 0x45300000;
    local_70 = (auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    for (local_78 = *(long *)(in_R8 + in_RDI * 8); local_78 < *(long *)(in_R8 + 8 + in_RDI * 8);
        local_78 = local_78 + 1) {
      local_70 = (double)*(float *)(in_stack_00000008 + *(long *)(in_RCX + local_78 * 8) * 4) +
                 local_70;
    }
    if (local_70 <= 0.0) {
      local_8 = -INFINITY;
    }
    else {
      if (in_R9D == 0) {
        for (local_90 = *(long *)(in_R8 + in_RDI * 8); local_90 < *(long *)(in_R8 + 8 + in_RDI * 8);
            local_90 = local_90 + 1) {
          dVar5 = (double)*(float *)(in_stack_00000008 + *(long *)(in_RCX + local_90 * 8) * 4);
          dVar6 = (double)*(float *)(in_RDX + local_90 * 4);
          dVar7 = dVar6 * dVar6;
          local_40 = fma(dVar5,dVar6,local_40);
          local_48 = fma(dVar5,dVar7,local_48);
          local_50 = fma(dVar5,dVar7 * dVar6,local_50);
          local_58 = fma(dVar5,dVar7 * dVar7,local_58);
        }
      }
      else {
        for (local_88 = *(long *)(in_R8 + in_RDI * 8); local_88 < *(long *)(in_R8 + 8 + in_RDI * 8);
            local_88 = local_88 + 1) {
          dVar5 = (double)*(float *)(in_stack_00000008 + *(long *)(in_RCX + local_88 * 8) * 4);
          dVar6 = (double)*(float *)(in_RDX + local_88 * 4);
          uVar2 = std::isnan(dVar6);
          in_stack_ffffffffffffff57 = 1;
          if ((uVar2 & 1) == 0) {
            iVar3 = std::isinf(dVar6);
            in_stack_ffffffffffffff57 = (byte)iVar3;
          }
          if ((in_stack_ffffffffffffff57 & 1) == 0) {
            dVar7 = dVar6 * dVar6;
            local_40 = fma(dVar5,dVar6,local_40);
            local_48 = fma(dVar5,dVar7,local_48);
            local_50 = fma(dVar5,dVar7 * dVar6,local_50);
            local_58 = fma(dVar5,dVar7 * dVar7,local_58);
          }
          else {
            local_70 = local_70 - dVar5;
          }
        }
        if (local_70 <= 0.0) {
          return -INFINITY;
        }
      }
      uVar9 = true;
      if (1.0 < local_70) {
        uVar9 = true;
        if ((local_48 != 0.0) || (NAN(local_48))) {
          uVar9 = local_48 == local_40 * local_40;
        }
      }
      if ((bool)uVar9 == false) {
        dVar5 = local_40 / local_70;
        Xc_00 = (float *)(-dVar5 * dVar5 + local_48 / local_70);
        uVar2 = std::isnan((double)Xc_00);
        if ((uVar2 & 1) == 0) {
          col = Xc_00;
          dVar6 = std::numeric_limits<double>::epsilon();
          if ((dVar6 < (double)Xc_00) ||
             (bVar1 = check_more_than_two_unique_values<float,long>
                                ((size_t)dVar5,(size_t)col,in_stack_ffffffffffffff58,
                                 (long *)CONCAT17(in_stack_ffffffffffffff57,
                                                  CONCAT16(uVar9,in_stack_ffffffffffffff50)),Xc_00,
                                 (MissingAction)((ulong)in_stack_ffffffffffffff40 >> 0x20)), bVar1))
          {
            if ((double)col <= 0.0) {
              local_8 = -INFINITY;
            }
            else {
              local_8 = (local_70 * dVar5 * dVar5 * dVar5 * dVar5 +
                        -(local_40 * 4.0) * dVar5 * dVar5 * dVar5 +
                        local_48 * 6.0 * dVar5 * dVar5 + -(local_50 * 4.0) * dVar5 + local_58) /
                        (local_70 * (double)col * (double)col);
              uVar2 = std::isnan(local_8);
              if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(local_8), (uVar2 & 1) == 0)) {
                if (local_8 <= 0.0) {
                  local_8 = 0.0;
                }
              }
              else {
                local_8 = -INFINITY;
              }
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
      else {
        local_8 = -INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}